

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O2

bool __thiscall wasm::BranchUtils::hasBranchTarget(BranchUtils *this,Expression *ast,Name target)

{
  undefined1 uVar1;
  Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_> local_118;
  undefined1 uStack_40;
  undefined7 uStack_3f;
  undefined1 local_38;
  undefined7 uStack_37;
  undefined1 local_30;
  Expression *local_20;
  Expression *ast_local;
  
  if (target.super_IString.str._M_len == 0) {
    uVar1 = 0;
  }
  else {
    local_118.replacep = (Expression **)0x0;
    local_118.stack.usedFixed = 0;
    local_118.currModule = (Module *)0x0;
    local_30 = 0;
    local_118.stack.flexible.
    super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_118.stack.flexible.
    super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_118.stack.flexible.
    super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_118.currFunction = (Function *)0x0;
    uStack_40 = SUB81(ast,0);
    uStack_3f = (undefined7)((ulong)ast >> 8);
    local_38 = (undefined1)target.super_IString.str._M_len;
    uStack_37 = target.super_IString.str._M_len._1_7_;
    local_20 = (Expression *)this;
    Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::walk(&local_118,&local_20);
    uVar1 = local_30;
    std::
    _Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
    ::~_Vector_base(&local_118.stack.flexible.
                     super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
                   );
  }
  return (bool)uVar1;
}

Assistant:

inline bool hasBranchTarget(Expression* ast, Name target) {
  if (!target.is()) {
    return false;
  }

  struct Scanner
    : public PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>> {
    Name target;
    bool has = false;

    void visitExpression(Expression* curr) {
      operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name == target) {
          has = true;
        }
      });
    }
  };
  Scanner scanner;
  scanner.target = target;
  scanner.walk(ast);
  return scanner.has;
}